

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

optional<common::ConfigError> *
common::InitConfig(optional<common::ConfigError> *__return_storage_ptr__,ArgsManager *args,
                  SettingsAbortFn settings_abort_fn)

{
  long *plVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string_view source_file;
  string arg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  ChainType chain;
  size_t sVar7;
  Logger *pLVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string *strDefault;
  path *strDefault_00;
  long in_RDX;
  undefined1 auVar10 [8];
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string error_1;
  string config_source;
  string cli_config_path;
  path base_config_path;
  path net_path;
  path base_path;
  string error;
  path orig_config_path;
  path orig_datadir_path;
  string log_msg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  details;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc58;
  undefined8 in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  allocator<char> local_369;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_368 [3];
  long *local_338;
  long local_330;
  long local_328 [2];
  string local_318;
  string local_2f8;
  string local_2d8;
  path local_2b8;
  path local_290;
  path local_268;
  path local_240;
  path local_218;
  path local_1f0;
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  path local_188;
  undefined1 local_160 [40];
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  undefined2 local_70;
  undefined1 local_58 [16];
  _Alloc_hider local_48;
  undefined8 local_38;
  
  local_38 = *(size_type *)(in_FS_OFFSET + 0x28);
  bVar4 = CheckDataDirOption(args);
  if (!bVar4) {
    local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
    local_138._0_8_ = &local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Specified data directory \"%s\" does not exist.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"Specified data directory \"%s\" does not exist.","");
    }
    else {
      local_160._0_8_ = "Specified data directory \"%s\" does not exist.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_160);
    }
    paVar3 = &local_188._M_pathname.field_2;
    local_188._M_pathname._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_1a8 + 0x20),"-datadir","");
    paVar2 = &local_1f0._M_pathname.field_2;
    local_1f0._M_pathname._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
    strDefault_00 = &local_1f0;
    ArgsManager::GetArg((string *)local_160,args,(string *)(local_1a8 + 0x20),
                        (string *)strDefault_00);
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)local_f0,(tinyformat *)local_138,(bilingual_str *)local_160,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)strDefault_00);
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Optional_payload_base<common::ConfigError>::_Storage<common::ConfigError,_false>::
    _Storage<common::ConfigError>
              ((_Storage<common::ConfigError,_false> *)__return_storage_ptr__,local_f8);
    (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>)._M_payload.
    super__Optional_payload<common::ConfigError,_true,_false,_false>.
    super__Optional_payload_base<common::ConfigError>._M_engaged = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._0_8_ != &local_e0) {
      operator_delete((void *)local_f0._0_8_,local_e0._0_8_ + 1);
    }
    if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
      operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_pathname._M_dataplus._M_p != paVar2) {
      operator_delete(local_1f0._M_pathname._M_dataplus._M_p,
                      local_1f0._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_pathname._M_dataplus._M_p != paVar3) {
      operator_delete(local_188._M_pathname._M_dataplus._M_p,
                      local_188._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._0_8_ != &local_128) {
      operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
    }
    goto LAB_006975d2;
  }
  ArgsManager::GetDataDir((path *)local_160,args,false);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-conf","");
  local_1f0._M_pathname._M_dataplus._M_p = "bitcoin.conf";
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            ((path *)local_138,(char **)&local_1f0,auto_format);
  arg._M_string_length = in_stack_fffffffffffffc60;
  arg._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc58;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffffc68;
  arg.field_2._8_4_ = in_stack_fffffffffffffc70;
  arg.field_2._12_4_ = in_stack_fffffffffffffc74;
  ArgsManager::GetPathArg((path *)local_f8,args,arg,(path *)local_1a8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  AbsPathForConfigVal((path *)(local_1a8 + 0x20),args,(path *)local_f8,false);
  std::filesystem::__cxx11::path::~path((path *)local_f8);
  std::filesystem::__cxx11::path::~path((path *)local_138);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1c8._0_8_ = local_1c8 + 0x10;
  local_1c8._8_8_ = 0;
  local_1c8[0x10] = '\0';
  bVar4 = ArgsManager::ReadConfigFiles(args,(string *)local_1c8,true);
  if (bVar4) {
    chain = ArgsManager::GetChainType(args);
    SelectParams(chain);
    ArgsManager::GetDataDir((path *)&local_1f0,args,false);
    cVar5 = std::filesystem::status(&local_1f0);
    if ((cVar5 == -1) || (cVar5 == '\0')) {
      std::filesystem::__cxx11::path::path(&local_218,(path *)&local_1f0);
      std::filesystem::__cxx11::path::_M_append(&local_218,7,"wallets");
      std::filesystem::__cxx11::path::path((path *)local_f8,&local_218);
      cVar5 = std::filesystem::symlink_status((path *)local_f8);
      if ((cVar5 != '\x03') || (cVar5 = std::filesystem::status((path *)local_f8), cVar5 != '\x02'))
      {
        std::filesystem::create_directories((path *)local_f8);
      }
      std::filesystem::__cxx11::path::~path((path *)local_f8);
      std::filesystem::__cxx11::path::~path(&local_218);
    }
    ArgsManager::GetDataDir((path *)&local_240,args,true);
    cVar5 = std::filesystem::status(&local_240);
    if ((cVar5 == -1) || (cVar5 == '\0')) {
      std::filesystem::__cxx11::path::path(&local_268,(path *)&local_240);
      std::filesystem::__cxx11::path::_M_append(&local_268,7,"wallets");
      std::filesystem::__cxx11::path::path((path *)local_f8,&local_268);
      cVar5 = std::filesystem::symlink_status((path *)local_f8);
      if ((cVar5 != '\x03') || (cVar5 = std::filesystem::status((path *)local_f8), cVar5 != '\x02'))
      {
        std::filesystem::create_directories((path *)local_f8);
      }
      std::filesystem::__cxx11::path::~path((path *)local_f8);
      std::filesystem::__cxx11::path::~path(&local_268);
    }
    std::filesystem::__cxx11::path::path(&local_2b8,(path *)&local_1f0);
    sVar7 = strlen("bitcoin.conf");
    std::filesystem::__cxx11::path::_M_append(&local_2b8,sVar7,"bitcoin.conf");
    std::filesystem::__cxx11::path::path(&local_290,&local_2b8);
    std::filesystem::__cxx11::path::~path(&local_2b8);
    cVar5 = std::filesystem::status((path *)&local_290);
    if (((cVar5 == '\0') || (cVar5 == -1)) ||
       (cVar5 = std::filesystem::equivalent((path *)(local_1a8 + 0x20),(path *)&local_290),
       cVar5 != '\0')) {
LAB_006972c3:
      bVar6 = ArgsManager::GetSettingsPath(args,(path *)0x0,false,false);
      bVar4 = true;
      if (bVar6) {
        local_58._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_58._8_8_ = (pointer)0x0;
        local_48._M_p = (pointer)0x0;
        bVar6 = ArgsManager::ReadSettingsFile
                          (args,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58);
        if (bVar6) {
LAB_0069753f:
          bVar6 = ArgsManager::WriteSettingsFile
                            (args,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_58,false);
          if (bVar6) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_58);
            goto LAB_00697566;
          }
          local_138._0_8_ = &local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"Settings file could not be written","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"Settings file could not be written","");
          }
          else {
            local_78 = (string *)0x87b156;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_78);
          }
          local_f8._0_4_ = 1;
          local_f0._0_8_ = &local_e0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_f0,local_138._0_8_,
                     (string *)(local_138._0_8_ + local_138._8_8_));
          local_d0._M_p = (pointer)&local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,local_118._M_dataplus._M_p,
                     (_Impl *)(local_118._M_dataplus._M_p + local_118._M_string_length));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_b0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_58);
          std::_Optional_payload_base<common::ConfigError>::_Storage<common::ConfigError,_false>::
          _Storage<common::ConfigError>
                    ((_Storage<common::ConfigError,_false> *)__return_storage_ptr__,local_f8);
          (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>).
          _M_payload.super__Optional_payload<common::ConfigError,_true,_false,_false>.
          super__Optional_payload_base<common::ConfigError>._M_engaged = true;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_p != &local_c0) {
            operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._0_8_ != &local_e0) {
            operator_delete((void *)local_f0._0_8_,local_e0._0_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_006974e4;
        }
        else {
          local_138._0_8_ = &local_128;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_138,"Settings file could not be read","");
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,"Settings file could not be read","");
          }
          else {
            local_78 = (string *)0x87b136;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_78);
          }
          if (*(long *)(in_RDX + 0x10) == 0) {
            local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
            local_f0._0_8_ = &local_e0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_f0,local_138._0_8_,
                       (string *)(local_138._0_8_ + local_138._8_8_));
            local_d0._M_p = (pointer)&local_c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_d0,local_118._M_dataplus._M_p,
                       local_118._M_string_length + (long)local_118._M_dataplus._M_p);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_b0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
            std::_Optional_payload_base<common::ConfigError>::_Storage<common::ConfigError,_false>::
            _Storage<common::ConfigError>
                      ((_Storage<common::ConfigError,_false> *)__return_storage_ptr__,local_f8);
            (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>).
            _M_payload.super__Optional_payload<common::ConfigError,_true,_false,_false>.
            super__Optional_payload_base<common::ConfigError>._M_engaged = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_p != &local_c0) {
              operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._0_8_ != &local_e0) {
              operator_delete((void *)local_f0._0_8_,local_e0._0_8_ + 1);
            }
          }
          else {
            cVar5 = (**(code **)(in_RDX + 0x18))();
            if (cVar5 == '\0') {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_58,(pointer)local_58._0_8_);
              bilingual_str::~bilingual_str((bilingual_str *)local_138);
              goto LAB_0069753f;
            }
            local_f8._0_4_ = 2;
            bilingual_str::bilingual_str((bilingual_str *)local_f0,(bilingual_str *)local_138);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_b0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_58);
            std::_Optional_payload_base<common::ConfigError>::_Storage<common::ConfigError,_false>::
            _Storage<common::ConfigError>
                      ((_Storage<common::ConfigError,_false> *)__return_storage_ptr__,
                       (ConfigError *)local_f8);
            (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>).
            _M_payload.super__Optional_payload<common::ConfigError,_true,_false,_false>.
            super__Optional_payload_base<common::ConfigError>._M_engaged = true;
            ConfigError::~ConfigError((ConfigError *)local_f8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
LAB_006974e4:
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._0_8_ != &local_128) {
          operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_58);
        goto LAB_0069751e;
      }
    }
    else {
      plVar1 = (long *)(local_f0 + 8);
      local_f8 = (undefined1  [8])plVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"-conf","");
      local_138._0_8_ = &local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
      strDefault = (string *)local_138;
      ArgsManager::GetArg(&local_2d8,args,(string *)local_f8,strDefault);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._0_8_ != &local_128) {
        operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
      }
      if (local_f8 != (undefined1  [8])plVar1) {
        operator_delete((void *)local_f8,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
      }
      if (local_2d8._M_string_length == 0) {
        local_f8 = (undefined1  [8])plVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f8,local_160._0_8_,(char *)(local_160._0_8_ + local_160._8_8_));
        local_138._8_2_ = 0x2622;
        local_138._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_f8;
        tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                  (&local_2f8,(tinyformat *)"data directory %s",local_138,
                   (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                    *)strDefault);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8
                       ,"-conf=",&local_2d8);
        local_58._8_2_ = 0x2622;
        local_58._0_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
        tinyformat::format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
                  (&local_2f8,(tinyformat *)"command line argument %s",local_58,
                   (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                    *)strDefault);
      }
      if (local_f8 != (undefined1  [8])plVar1) {
        operator_delete((void *)local_f8,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
      }
      local_f8 = (undefined1  [8])plVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,local_1f0._M_pathname._M_dataplus._M_p,
                 local_1f0._M_pathname._M_dataplus._M_p + local_1f0._M_pathname._M_string_length);
      local_70 = 0x2622;
      local_78 = (string *)local_f8;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_138,"bitcoin.conf",&local_369);
      local_98._M_string_length._0_2_ = 0x2622;
      local_98._M_dataplus._M_p = (pointer)local_138;
      local_58._0_8_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,local_188._M_pathname._M_dataplus._M_p,
                 (_Impl *)(local_188._M_pathname._M_string_length +
                          (long)local_188._M_pathname._M_dataplus._M_p));
      local_368[0]._M_delim = '\"';
      local_368[0]._M_escape = '&';
      pbVar9 = &local_98;
      local_368[0]._M_string =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
      tinyformat::
      format<std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>,std::__cxx11::string>
                (&local_318,
                 (tinyformat *)
                 "Data directory %1$s contains a %2$s file which is ignored, because a different configuration file %3$s from %4$s is being used instead. Possible ways to address this would be to:\n- Delete or rename the %2$s file in data directory %1$s.\n- Change datadir= or conf= options to specify one configuration file, not two, and use includeconf= to include any other configuration files.\n- Set allowignoredconf=1 option to treat this condition as a warning, not an error."
                 ,(char *)&local_78,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)pbVar9,local_368,
                 (_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                  *)&local_2f8,in_stack_fffffffffffffc58);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48) {
        operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._0_8_ != &local_128) {
        operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
      }
      if (local_f8 != (undefined1  [8])plVar1) {
        operator_delete((void *)local_f8,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
      }
      local_f8 = (undefined1  [8])plVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"-allowignoredconf","");
      bVar4 = ArgsManager::GetBoolArg(args,(string *)local_f8,false);
      if (local_f8 != (undefined1  [8])plVar1) {
        operator_delete((void *)local_f8,CONCAT71(local_f0._9_7_,local_f0[8]) + 1);
      }
      if (bVar4) {
        pLVar8 = LogInstance();
        bVar6 = BCLog::Logger::Enabled(pLVar8);
        if (bVar6) {
          local_f0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_f0[8] = '\0';
          local_f8 = (undefined1  [8])plVar1;
          tinyformat::format<std::__cxx11::string>
                    ((string *)local_138,(tinyformat *)"Warning: %s\n",(char *)&local_318,pbVar9);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._0_8_ != &local_128) {
            operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
          }
          pLVar8 = LogInstance();
          local_138._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x58;
          local_138._8_8_ =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/init.cpp"
          ;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/init.cpp"
          ;
          source_file._M_len = 0x58;
          str._M_str = (char *)local_f8;
          str._M_len = local_f0._0_8_;
          logging_function._M_str = "InitConfig";
          logging_function._M_len = 10;
          BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x55,ALL,Info);
          if (local_f8 != (undefined1  [8])plVar1) {
            local_328[0] = CONCAT71(local_f0._9_7_,local_f0[8]);
            auVar10 = local_f8;
            goto LAB_0069724d;
          }
        }
      }
      else {
        local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
        local_338 = local_328;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,local_318._M_dataplus._M_p,
                   local_318._M_dataplus._M_p + local_318._M_string_length);
        local_f0._0_8_ = &local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,local_338,(long)local_338 + local_330);
        local_d0._M_p = (pointer)&local_c0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_338,(long)local_338 + local_330);
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::_Optional_payload_base<common::ConfigError>::_Storage<common::ConfigError,_false>::
        _Storage<common::ConfigError>
                  ((_Storage<common::ConfigError,_false> *)__return_storage_ptr__);
        (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>)._M_payload
        .super__Optional_payload<common::ConfigError,_true,_false,_false>.
        super__Optional_payload_base<common::ConfigError>._M_engaged = true;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._0_8_ != &local_e0) {
          operator_delete((void *)local_f0._0_8_,local_e0._0_8_ + 1);
        }
        auVar10 = (undefined1  [8])local_338;
        if (local_338 != local_328) {
LAB_0069724d:
          operator_delete((void *)auVar10,local_328[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) goto LAB_006972c3;
LAB_0069751e:
      bVar4 = false;
    }
LAB_00697566:
    std::filesystem::__cxx11::path::~path(&local_290);
    std::filesystem::__cxx11::path::~path((path *)&local_240);
    std::filesystem::__cxx11::path::~path((path *)&local_1f0);
  }
  else {
    local_f8 = (undefined1  [8])((ulong)local_f8 & 0xffffffff00000000);
    local_138._0_8_ = &local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_138,"Error reading configuration file: %s","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_118,"Error reading configuration file: %s","");
    }
    else {
      local_1f0._M_pathname._M_dataplus._M_p = "Error reading configuration file: %s";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_118,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&local_1f0);
    }
    tinyformat::format<std::__cxx11::string>
              ((bilingual_str *)local_f0,(tinyformat *)local_138,(bilingual_str *)local_1c8,pbVar9);
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::_Optional_payload_base<common::ConfigError>::_Storage<common::ConfigError,_false>::
    _Storage<common::ConfigError>
              ((_Storage<common::ConfigError,_false> *)__return_storage_ptr__,local_f8);
    (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>)._M_payload.
    super__Optional_payload<common::ConfigError,_true,_false,_false>.
    super__Optional_payload_base<common::ConfigError>._M_engaged = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_p != &local_c0) {
      operator_delete(local_d0._M_p,local_c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._0_8_ != &local_e0) {
      operator_delete((void *)local_f0._0_8_,local_e0._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._0_8_ != &local_128) {
      operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
    operator_delete((void *)local_1c8._0_8_,CONCAT71(local_1c8._17_7_,local_1c8[0x10]) + 1);
  }
  std::filesystem::__cxx11::path::~path((path *)(local_1a8 + 0x20));
  std::filesystem::__cxx11::path::~path((path *)local_160);
  if (bVar4) {
    (__return_storage_ptr__->super__Optional_base<common::ConfigError,_false,_false>)._M_payload.
    super__Optional_payload<common::ConfigError,_true,_false,_false>.
    super__Optional_payload_base<common::ConfigError>._M_engaged = false;
  }
LAB_006975d2:
  if (*(size_type *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<ConfigError> InitConfig(ArgsManager& args, SettingsAbortFn settings_abort_fn)
{
    try {
        if (!CheckDataDirOption(args)) {
            return ConfigError{ConfigStatus::FAILED, strprintf(_("Specified data directory \"%s\" does not exist."), args.GetArg("-datadir", ""))};
        }

        // Record original datadir and config paths before parsing the config
        // file. It is possible for the config file to contain a datadir= line
        // that changes the datadir path after it is parsed. This is useful for
        // CLI tools to let them use a different data storage location without
        // needing to pass it every time on the command line. (It is not
        // possible for the config file to cause another configuration to be
        // used, though. Specifying a conf= option in the config file causes a
        // parse error, and specifying a datadir= location containing another
        // bitcoin.conf file just ignores the other file.)
        const fs::path orig_datadir_path{args.GetDataDirBase()};
        const fs::path orig_config_path{AbsPathForConfigVal(args, args.GetPathArg("-conf", BITCOIN_CONF_FILENAME), /*net_specific=*/false)};

        std::string error;
        if (!args.ReadConfigFiles(error, true)) {
            return ConfigError{ConfigStatus::FAILED, strprintf(_("Error reading configuration file: %s"), error)};
        }

        // Check for chain settings (Params() calls are only valid after this clause)
        SelectParams(args.GetChainType());

        // Create datadir if it does not exist.
        const auto base_path{args.GetDataDirBase()};
        if (!fs::exists(base_path)) {
            // When creating a *new* datadir, also create a "wallets" subdirectory,
            // whether or not the wallet is enabled now, so if the wallet is enabled
            // in the future, it will use the "wallets" subdirectory for creating
            // and listing wallets, rather than the top-level directory where
            // wallets could be mixed up with other files. For backwards
            // compatibility, wallet code will use the "wallets" subdirectory only
            // if it already exists, but never create it itself. There is discussion
            // in https://github.com/bitcoin/bitcoin/issues/16220 about ways to
            // change wallet code so it would no longer be necessary to create
            // "wallets" subdirectories here.
            fs::create_directories(base_path / "wallets");
        }
        const auto net_path{args.GetDataDirNet()};
        if (!fs::exists(net_path)) {
            fs::create_directories(net_path / "wallets");
        }

        // Show an error or warning if there is a bitcoin.conf file in the
        // datadir that is being ignored.
        const fs::path base_config_path = base_path / BITCOIN_CONF_FILENAME;
        if (fs::exists(base_config_path) && !fs::equivalent(orig_config_path, base_config_path)) {
            const std::string cli_config_path = args.GetArg("-conf", "");
            const std::string config_source = cli_config_path.empty()
                ? strprintf("data directory %s", fs::quoted(fs::PathToString(orig_datadir_path)))
                : strprintf("command line argument %s", fs::quoted("-conf=" + cli_config_path));
            const std::string error = strprintf(
                "Data directory %1$s contains a %2$s file which is ignored, because a different configuration file "
                "%3$s from %4$s is being used instead. Possible ways to address this would be to:\n"
                "- Delete or rename the %2$s file in data directory %1$s.\n"
                "- Change datadir= or conf= options to specify one configuration file, not two, and use "
                "includeconf= to include any other configuration files.\n"
                "- Set allowignoredconf=1 option to treat this condition as a warning, not an error.",
                fs::quoted(fs::PathToString(base_path)),
                fs::quoted(BITCOIN_CONF_FILENAME),
                fs::quoted(fs::PathToString(orig_config_path)),
                config_source);
            if (args.GetBoolArg("-allowignoredconf", false)) {
                LogPrintf("Warning: %s\n", error);
            } else {
                return ConfigError{ConfigStatus::FAILED, Untranslated(error)};
            }
        }

        // Create settings.json if -nosettings was not specified.
        if (args.GetSettingsPath()) {
            std::vector<std::string> details;
            if (!args.ReadSettingsFile(&details)) {
                const bilingual_str& message = _("Settings file could not be read");
                if (!settings_abort_fn) {
                    return ConfigError{ConfigStatus::FAILED, message, details};
                } else if (settings_abort_fn(message, details)) {
                    return ConfigError{ConfigStatus::ABORTED, message, details};
                } else {
                    details.clear(); // User chose to ignore the error and proceed.
                }
            }
            if (!args.WriteSettingsFile(&details)) {
                const bilingual_str& message = _("Settings file could not be written");
                return ConfigError{ConfigStatus::FAILED_WRITE, message, details};
            }
        }
    } catch (const std::exception& e) {
        return ConfigError{ConfigStatus::FAILED, Untranslated(e.what())};
    }
    return {};
}